

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001b6950 = 0x2e2e2e2e2e2e2e;
    uRam00000000001b6957 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b6940 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b6948 = 0x2e2e2e2e2e2e2e;
    DAT_001b694f = 0x2e;
    _DAT_001b6930 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b6938 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001b6920 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b6928 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001b6918 = 0x2e2e2e2e2e2e2e2e;
    DAT_001b695f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }